

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::sum(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  Node tNode;
  string local_150;
  Node local_130;
  Node local_f0;
  Node local_b0;
  Node local_70;
  
  term(__return_storage_ptr__,this);
  while (lVar1 = (this->lexer).lexem.type, lVar1 - PLUS < 4) {
    Node::Node(&local_130,__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_150,(string *)&(this->lexer).lexem.value);
    Node::Node(&local_70,lVar1 - SEMICOLON,&local_150);
    Node::operator=(__return_storage_ptr__,&local_70);
    Node::~Node(&local_70);
    std::__cxx11::string::~string((string *)&local_150);
    nextLexem(this);
    Node::Node(&local_f0,&local_130);
    std::vector<Node,_std::allocator<Node>_>::push_back(&__return_storage_ptr__->subnodes,&local_f0)
    ;
    Node::~Node(&local_f0);
    term(&local_b0,this);
    std::vector<Node,_std::allocator<Node>_>::push_back(&__return_storage_ptr__->subnodes,&local_b0)
    ;
    Node::~Node(&local_b0);
    Node::~Node(&local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::sum() {
    Node termNode = term(); // sumNode = var
    nodekind kind;
    while (getLexemType() == PLUS || getLexemType() == MINUS || getLexemType() == MULTIPLICATION
           || getLexemType() == DIVISION) {
        switch (getLexemType()) {
            case PLUS:
                kind = ADD;
                break;
            case MINUS:
                kind = SUB;
                break;
            case MULTIPLICATION:
                kind = MUL;
                break;
            case DIVISION:
                kind = DIV;
                break;
        }
        Node tNode = Node(termNode);
        termNode = Node(kind, getLexemValue());
        nextLexem();
        termNode.addSubnode(tNode);
        termNode.addSubnode(term());
    }
    return termNode;
}